

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_int>::sortMaxUp
          (btAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,btDispatcher *param_3,
          bool updateOverlaps)

{
  int *piVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Handle *pHVar4;
  btOverlappingPairCallback *pbVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  uint uVar11;
  Handle *pHVar12;
  Handle *pHVar13;
  long lVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  
  lVar10 = (long)axis;
  uVar6 = this->m_pEdges[lVar10][(ulong)edge + 1].m_handle;
  if (uVar6 != 0) {
    puVar9 = &this->m_pEdges[lVar10][edge].m_handle;
    uVar3 = *puVar9;
    uVar11 = 1 << ((byte)axis & 0x1f) & 3;
    pHVar4 = this->m_pHandles;
    uVar8 = 1 << (sbyte)uVar11 & 3;
    do {
      if (((Edge *)(puVar9 + -1))->m_pos < puVar9[1]) {
        return;
      }
      pHVar12 = this->m_pHandles + uVar6;
      bVar15 = (puVar9[1] & 1) == 0;
      lVar14 = 0x48;
      if (bVar15) {
        lVar14 = 0x3c;
      }
      if ((((bVar15 && updateOverlaps) &&
           (lVar14 = 0x3c,
           *(uint *)((long)(&(pHVar12->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar11 * 4)
                    ) <= *(uint *)((long)pHVar4[uVar3].m_maxEdges + (ulong)(uVar11 * 4)))) &&
          (*(uint *)((long)(&pHVar4[uVar3].super_btBroadphaseProxy.m_aabbMax + 1) +
                    (ulong)(uVar11 * 4)) <=
           *(uint *)((long)pHVar12->m_maxEdges + (ulong)(uVar11 * 4)))) &&
         ((uVar7 = (ulong)(uVar8 * 4),
          *(uint *)((long)(&(pHVar12->super_btBroadphaseProxy).m_aabbMax + 1) + uVar7) <=
          *(uint *)((long)pHVar4[uVar3].m_maxEdges + uVar7) &&
          (uVar7 = (ulong)(uVar8 * 4),
          *(uint *)((long)(&pHVar4[uVar3].super_btBroadphaseProxy.m_aabbMax + 1) + uVar7) <=
          *(uint *)((long)pHVar12->m_maxEdges + uVar7))))) {
        pHVar13 = this->m_pHandles + *puVar9;
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
                  (this->m_pairCache,pHVar13,pHVar12);
        pbVar5 = this->m_userPairCallback;
        if (pbVar5 != (btOverlappingPairCallback *)0x0) {
          (*pbVar5->_vptr_btOverlappingPairCallback[2])(pbVar5,pHVar13,pHVar12);
        }
      }
      piVar1 = (int *)((long)(pHVar12->super_btBroadphaseProxy).m_aabbMin.m_floats +
                      lVar10 * 4 + lVar14 + -0x1c);
      *piVar1 = *piVar1 + -1;
      pHVar4[uVar3].m_maxEdges[lVar10] = pHVar4[uVar3].m_maxEdges[lVar10] + 1;
      auVar2 = *(undefined1 (*) [16])(puVar9 + -1);
      auVar16._0_8_ = auVar2._8_8_;
      auVar16._8_4_ = auVar2._0_4_;
      auVar16._12_4_ = auVar2._4_4_;
      *(undefined1 (*) [16])(puVar9 + -1) = auVar16;
      uVar6 = puVar9[4];
      puVar9 = puVar9 + 2;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1  << axis) & 3;
		const int axis2 = (1  << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext,axis1,axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0,handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0,handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
	
}